

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void qrdecomp(double *A,int M,int N,double *bvec)

{
  double *x_00;
  double *v_00;
  double *A_00;
  double *C;
  int iVar1;
  double alpha;
  double beta;
  double *w;
  double *AT;
  double *v;
  double *x;
  int local_30;
  int t;
  int u;
  int k;
  int i;
  int j;
  double *bvec_local;
  int N_local;
  int M_local;
  double *A_local;
  
  if (N <= M) {
    x_00 = (double *)malloc((long)M << 3);
    v_00 = (double *)malloc((long)M << 3);
    A_00 = (double *)malloc((long)M * 8 * (long)N);
    C = (double *)malloc((long)M * 8 * (long)M);
    for (k = 0; k < N; k = k + 1) {
      for (u = k; u < M; u = u + 1) {
        x_00[u - k] = A[u * N + k];
      }
      alpha = house(x_00,M - k,v_00);
      bvec[k] = alpha;
      for (u = k; u < M; u = u + 1) {
        local_30 = 0;
        for (t = k; t < N; t = t + 1) {
          A_00[(local_30 + u) - k] = A[t + u * N];
          local_30 = (M - k) + local_30;
        }
      }
      mmult(A_00,v_00,C,N - k,M - k,1);
      scale(C,N - k,1,alpha);
      mmult(v_00,C,A_00,M - k,1,N - k);
      for (u = k; u < M; u = u + 1) {
        for (t = k; t < N; t = t + 1) {
          iVar1 = u * N + t;
          A[iVar1] = A[iVar1] - A_00[((u - k) * (N - k) + t) - k];
        }
      }
      u = k;
      if (k < M) {
        while (u = u + 1, u < M) {
          A[u * N + k] = v_00[u - k];
        }
      }
    }
    free(x_00);
    free(v_00);
    free(A_00);
    free(C);
    return;
  }
  printf("M should be greater than or equal to N");
  exit(1);
}

Assistant:

void qrdecomp(double *A, int M, int N,double *bvec) {
	int j,i,k,u,t;
	double *x,*v,*AT,*w;
	double beta;
	
	if (M < N) {
			printf("M should be greater than or equal to N");
			exit(1);
	}
	x = (double*) malloc(sizeof(double) * M);
	v = (double*) malloc(sizeof(double) * M);
	AT = (double*) malloc(sizeof(double) * M * N);
	w = (double*) malloc(sizeof(double) * M * M);
	
	for(j = 0; j < N;++j) {
		for(i=j;i < M;++i) {
			x[i-j] = A[i*N+j];
			
		}
		
		beta = house(x,M-j,v);
		bvec[j] = beta;
	
		for (i=j; i < M; i++) {
			t = i * N;
			u = 0;
			for (k=j; k < N; k++) {
				AT[u+i-j] = A[k+t];
				u+=(M-j);
				
			}
			
		}
		
		
		mmult(AT,v,w,N-j,M-j,1);
		scale(w,N-j,1,beta);
		mmult(v,w,AT,M-j,1,N-j);
		for (i=j; i < M; i++) {
			t = i *N;
			for (k=j; k < N; k++) {
				A[t+k] -= AT[(i-j)*(N-j) + k - j];
			}
		}
		if (j < M) {
			for(i=j+1;i < M;++i) {
				A[i*N+j] = v[i-j];
			}
		}
		 
	}
	
	free(x);
	free(v);
	free(AT);
	free(w);
	
}